

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O1

bool __thiscall Matrix<double>::operator==(Matrix<double> *this,Matrix<double> *op2)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  
  uVar5 = (ulong)this->n;
  bVar8 = (long)uVar5 < 1;
  if (0 < (long)uVar5) {
    uVar1 = this->m;
    uVar6 = 0;
    do {
      if (0 < (int)uVar1) {
        bVar2 = 0 < (long)(int)uVar1;
        if (ABS(*this->M[uVar6] - *op2->M[uVar6]) <= 1.1920928955078125e-07) {
          lVar7 = 0;
          do {
            if ((ulong)uVar1 - 1 == lVar7) goto LAB_0010cf3c;
            lVar3 = lVar7 + 1;
            lVar4 = lVar7 + 1;
            lVar7 = lVar7 + 1;
          } while (ABS(this->M[uVar6][lVar3] - op2->M[uVar6][lVar4]) <= 1.1920928955078125e-07);
          bVar2 = lVar7 < (int)uVar1;
        }
        if (bVar2) {
          return bVar8;
        }
      }
LAB_0010cf3c:
      uVar6 = uVar6 + 1;
      bVar8 = uVar5 <= uVar6;
    } while (uVar6 != uVar5);
  }
  return bVar8;
}

Assistant:

bool operator==(const Matrix<T>& op2) const {
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < m; j++) {
        if (std::is_floating_point<T>::value) {
          if (abs(M[i][j] - op2.M[i][j]) > FLT_EPSILON)
                return false;
        } else {
          if (M[i][j] != op2.M[i][j]) {
            return false;
          }
        }
      }
    }
    return true;
  }